

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

void __thiscall HttpResponse::parseHttpEnvelope(HttpResponse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringBufferHelper *pSVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pSVar2 = this->_pRawBuffer;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40," ","");
  StringBufferHelper::GetNextSegmentBySeparator(&local_a0,pSVar2,&local_40);
  std::__cxx11::string::operator=((string *)&this->_httpVersion,(string *)&local_a0);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pSVar2 = this->_pRawBuffer;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," ","");
  StringBufferHelper::GetNextSegmentBySeparator(&local_a0,pSVar2,&local_60);
  std::__cxx11::string::operator=((string *)&this->_httpStatusCode,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pSVar2 = this->_pRawBuffer;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\n","");
  StringBufferHelper::GetNextSegmentBySeparator(&local_a0,pSVar2,&local_80);
  std::__cxx11::string::operator=((string *)&this->_httpStatusText,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HttpResponse::parseHttpEnvelope() {
  _httpVersion = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusCode = _pRawBuffer->GetNextSegmentBySeparator(" ");
  _httpStatusText = _pRawBuffer->GetNextSegmentBySeparator("\n");
}